

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImRect::ClipWithFull(ImRect *this,ImRect *r)

{
  long in_RSI;
  ImVec2 *in_RDI;
  ImVec2 IVar1;
  ImVec2 *in_stack_ffffffffffffffd8;
  ImVec2 *v;
  ImVec2 in_stack_ffffffffffffffe8;
  
  v = *(ImVec2 **)(in_RSI + 8);
  IVar1 = ImClamp(v,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe8);
  *in_RDI = IVar1;
  IVar1 = ImClamp(v,in_stack_ffffffffffffffd8,IVar1);
  in_RDI[1] = IVar1;
  return;
}

Assistant:

ImVec4      ToVec4() const                      { return ImVec4(Min.x, Min.y, Max.x, Max.y); }